

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O0

int __thiscall counter::inc(counter *this)

{
  int iVar1;
  long in_RDI;
  int r;
  guard g;
  mutex_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  iVar1 = *(int *)(in_RDI + 0x28) + 1;
  *(int *)(in_RDI + 0x28) = iVar1;
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
  if (*(int *)(in_RDI + 0x24) < *(int *)(in_RDI + 0x20)) {
    *(undefined4 *)(in_RDI + 0x24) = *(undefined4 *)(in_RDI + 0x20);
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  return iVar1;
}

Assistant:

int inc() {
		guard g(lock_);
		int r = ++total;
		current++;
		if(max < current)
			max = current;
		return r;
	}